

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall
dxil_spv::CFGStructurizer::visit_for_back_edge_analysis(CFGStructurizer *this,CFGNode *entry)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  iterator iVar3;
  pointer pcVar4;
  CFGNode *pCVar5;
  pointer ppCVar6;
  __node_gen_type __node_gen;
  undefined1 local_50 [32];
  CFGNode *local_30;
  
  entry->visited = true;
  entry->traversing = true;
  local_50._0_8_ = &this->reachable_nodes;
  local_30 = entry;
  std::
  _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<dxil_spv::CFGNode_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
            ();
  ppCVar6 = (entry->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (entry->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar6 != ppCVar2) {
    do {
      pCVar5 = *ppCVar6;
      if (pCVar5->traversing == true) {
        iVar3._M_current =
             (pCVar5->fake_pred).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pCVar5->fake_pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_50._0_8_ = entry;
          std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
          _M_realloc_insert<dxil_spv::CFGNode*>
                    ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                      *)&pCVar5->fake_pred,iVar3,(CFGNode **)local_50);
        }
        else {
          *iVar3._M_current = entry;
          pppCVar1 = &(pCVar5->fake_pred).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
          local_50._0_8_ = entry;
        }
      }
      else if (pCVar5->visited == false) {
        visit_for_back_edge_analysis(this,pCVar5);
      }
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != ppCVar2);
  }
  entry->traversing = false;
  if (8 < (ulong)((long)(entry->fake_pred).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(entry->fake_pred).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    pCVar5 = CFGNodePool::create_node(this->pool);
    pcVar4 = (entry->name)._M_dataplus._M_p;
    local_50._0_8_ = (CFGNode *)(local_50 + 0x10);
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                         *)local_50,pcVar4,pcVar4 + (entry->name)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_50,".back-edge-merge");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&pCVar5->name,
                (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )local_50);
    if ((CFGNode *)local_50._0_8_ != (CFGNode *)(local_50 + 0x10)) {
      free_in_thread((void *)local_50._0_8_);
    }
    ppCVar2 = (entry->fake_pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar6 = (entry->fake_pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppCVar6 != ppCVar2;
        ppCVar6 = ppCVar6 + 1) {
      CFGNode::retarget_branch_pre_traversal(*ppCVar6,entry,pCVar5);
    }
    iVar3._M_current =
         (pCVar5->succ).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pCVar5->succ).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_50._0_8_ = entry;
      std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
      _M_realloc_insert<dxil_spv::CFGNode*>
                ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                 &pCVar5->succ,iVar3,(CFGNode **)local_50);
    }
    else {
      *iVar3._M_current = entry;
      pppCVar1 = &(pCVar5->succ).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
      local_50._0_8_ = entry;
    }
    (pCVar5->ir).terminator.type = Branch;
    (pCVar5->ir).terminator.direct_block = entry;
    CFGNode::add_branch(pCVar5,entry);
  }
  return;
}

Assistant:

void CFGStructurizer::visit_for_back_edge_analysis(CFGNode &entry)
{
	entry.visited = true;
	entry.traversing = true;
	reachable_nodes.insert(&entry);

	for (auto *succ : entry.succ)
	{
		// Reuse the existing vector to keep track of back edges.
		if (succ->traversing)
			succ->fake_pred.push_back(&entry);
		else if (!succ->visited)
			visit_for_back_edge_analysis(*succ);
	}

	entry.traversing = false;

	// After we get here, we must have observed all back edges.
	// If there is more than one back edge, merge them.
	if (entry.fake_pred.size() >= 2)
	{
		auto *new_back_edge = pool.create_node();
		new_back_edge->name = entry.name + ".back-edge-merge";
		for (auto *n : entry.fake_pred)
			n->retarget_branch_pre_traversal(&entry, new_back_edge);
		new_back_edge->succ.push_back(&entry);
		new_back_edge->ir.terminator.type = Terminator::Type::Branch;
		new_back_edge->ir.terminator.direct_block = &entry;
		new_back_edge->add_branch(&entry);
	}
}